

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::IfConversion::CheckPhiUsers(IfConversion *this,Instruction *phi,BasicBlock *block)

{
  BasicBlock *def;
  bool bVar1;
  DefUseManager *this_00;
  anon_class_16_2_e5bd8268 local_50;
  function<bool_(spvtools::opt::Instruction_*)> local_40;
  BasicBlock *local_20;
  BasicBlock *block_local;
  Instruction *phi_local;
  IfConversion *this_local;
  
  local_20 = block;
  block_local = (BasicBlock *)phi;
  phi_local = (Instruction *)this;
  this_00 = Pass::get_def_use_mgr(&this->super_Pass);
  def = block_local;
  local_50.block = local_20;
  local_50.this = this;
  std::function<bool(spvtools::opt::Instruction*)>::
  function<spvtools::opt::IfConversion::CheckPhiUsers(spvtools::opt::Instruction*,spvtools::opt::BasicBlock*)::__0,void>
            ((function<bool(spvtools::opt::Instruction*)> *)&local_40,&local_50);
  bVar1 = analysis::DefUseManager::WhileEachUser(this_00,(Instruction *)def,&local_40);
  std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_40);
  return bVar1;
}

Assistant:

bool IfConversion::CheckPhiUsers(Instruction* phi, BasicBlock* block) {
  return get_def_use_mgr()->WhileEachUser(
      phi, [block, this](Instruction* user) {
        if (user->opcode() == spv::Op::OpPhi &&
            context()->get_instr_block(user) == block)
          return false;
        return true;
      });
}